

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uchar *str;
  cs_insn *pcVar2;
  size_t sVar3;
  cs_err cVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  size_t __n;
  size_t sVar9;
  long lVar10;
  cs_insn *insn;
  size_t left;
  size_t cur;
  char a_buf [2048];
  cs_insn *local_868;
  size_t local_860;
  cs_insn *local_858;
  size_t local_850;
  size_t local_848;
  char *local_840;
  char local_838 [2056];
  
  puts("\nShould be invalid\n-----------------");
  cVar4 = cs_open(CS_ARCH_ARM,CS_MODE_MICRO,&handle);
  if (cVar4 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    cs_option(handle,CS_OPT_SYNTAX,3);
    pcVar6 = hex_string((uchar *)anon_var_dwarf_53,4);
    printf("%s %s: %s\n","Thumb",pcVar6,
           "invalid thumb2 pop because sp used and because both pc and lr are present at the same time"
          );
    free(pcVar6);
    sVar8 = cs_disasm(handle,(uint8_t *)anon_var_dwarf_53,4,0x1000,0,&local_868);
    if (sVar8 == 0) {
      puts("    SUCCESS: invalid");
    }
    else {
      puts("    ERROR:");
      lVar10 = 0;
      local_850 = sVar8;
      do {
        printf("    0x%lx:\t%s\t%s\n",*(undefined8 *)(local_868->bytes + lVar10 + -10),
               local_868->mnemonic + lVar10,local_868->op_str + lVar10);
        local_858 = (cs_insn *)0x0;
        local_860 = 0x800;
        snprint_insn_detail(local_838,(size_t *)&local_858,&local_860,
                            (cs_insn *)(local_868->bytes + lVar10 + -0x12));
        puts(local_838);
        lVar10 = lVar10 + 0xf0;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
      cs_free(local_868,local_850);
    }
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
  }
  cVar4 = cs_open(CS_ARCH_ARM,CS_MODE_MICRO,&handle);
  if (cVar4 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    cs_option(handle,CS_OPT_SYNTAX,3);
    puts("\nShould be valid\n---------------");
    lVar10 = 0;
    do {
      local_860 = 0x800;
      local_868 = (cs_insn *)0x0;
      str = (&PTR_anon_var_dwarf_24e_002659c8)[lVar10 * 5];
      sVar8 = (&DAT_002659d0)[lVar10 * 5];
      local_850 = lVar10;
      pcVar7 = hex_string(str,(int)sVar8);
      uVar1 = (&DAT_002659d8)[lVar10 * 10];
      pcVar6 = (&PTR_anon_var_dwarf_259_002659e0)[lVar10 * 5];
      printf("%s %s @ 0x%04x: %s\n    %s","Thumb",pcVar7,(ulong)uVar1,
             (&PTR_anon_var_dwarf_270_002659e8)[lVar10 * 5],pcVar6);
      sVar8 = cs_disasm(handle,str,sVar8,(ulong)uVar1,0,&local_858);
      if (sVar8 == 0) {
        puts("ERROR: invalid");
      }
      else {
        lVar10 = 0;
        local_848 = sVar8;
        local_840 = pcVar6;
        do {
          sVar3 = local_860;
          pcVar2 = local_868;
          iVar5 = snprintf(local_838 + (long)local_868,local_860,"0x%lx:\t%s\t%s\n",
                           *(uint64_t *)(local_858->mnemonic + lVar10 + -0x1a),
                           local_858->mnemonic + lVar10,local_858->op_str + lVar10);
          local_860 = sVar3 - (long)iVar5;
          local_868 = (cs_insn *)(pcVar2->bytes + (long)iVar5 + -0x12);
          snprint_insn_detail(local_838,(size_t *)&local_868,&local_860,
                              (cs_insn *)(local_858->bytes + lVar10 + -0x12));
          lVar10 = lVar10 + 0xf0;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
        __n = strlen(local_838);
        pcVar6 = local_840;
        sVar9 = strlen(local_840);
        if (__n < sVar9) {
          __n = sVar9;
        }
        iVar5 = bcmp(local_838,pcVar6,__n);
        if (iVar5 == 0) {
          puts("    SUCCESS: valid");
        }
        else {
          printf("    ERROR: \'\'\'\n%s\'\'\' does not match expected \'\'\'\n%s\'\'\'\n",local_838,
                 pcVar6);
        }
        cs_free(local_858,local_848);
      }
      lVar10 = local_850 + 1;
    } while (lVar10 != 3);
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
  }
  return 0;
}

Assistant:

static void test_invalids()
{
	struct invalid_instructions invalids[] = {{
		CS_ARCH_ARM,
			CS_MODE_THUMB,
			"Thumb",
			1,
			{{
				 (unsigned char *)"\xbd\xe8\x1e\xff",
				 4,
				 "invalid thumb2 pop because sp used and because both pc and lr are "
					 "present at the same time"
			 }},
	}};

	struct invalid_instructions * invalid = NULL;

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	int j;
	size_t count;

	printf("\nShould be invalid\n"
			"-----------------\n");

	for (i = 0; i < sizeof(invalids)/sizeof(invalids[0]); i++) {
		cs_err err;

		invalid = invalids + i;
		err = cs_open(invalid->arch, invalid->mode, &handle);

		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);
		cs_option(handle, CS_OPT_SYNTAX, CS_OPT_SYNTAX_NOREGNAME);

		for (j = 0; j < invalid->num_invalid_codes; ++j) {
			struct invalid_code * invalid_code = NULL;
			char * hex_str = NULL;

			invalid_code = invalid->invalid_codes + j;

			hex_str = hex_string(invalid_code->code, invalid_code->size);

			printf("%s %s: %s\n", invalid->platform_comment, hex_str, invalid_code->comment);

			free(hex_str);

			count = cs_disasm(handle,
					invalid_code->code, invalid_code->size, address, 0, &insn
					);

			if (count) {
				size_t k;
				printf("    ERROR:\n");

				for (k = 0; k < count; k++) {
					printf("    0x%"PRIx64":\t%s\t%s\n", 
							insn[k].address, insn[k].mnemonic, insn[k].op_str);
					print_insn_detail(&insn[k]);
				}
				cs_free(insn, count);

			} else {
				printf("    SUCCESS: invalid\n");
			}
		}

		cs_close(&handle);
	}
}